

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_parity_uint64_256_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ulong uVar4;
  uint j;
  ulong uVar5;
  long lVar6;
  block_t *vblock;
  
  uVar4 = 0;
  for (uVar5 = 0x22; uVar5 != 0x40; uVar5 = uVar5 + 1) {
    auVar3 = vpand_avx2(*(undefined1 (*) [32])v->w64,*(undefined1 (*) [32])At->w64);
    At = At + 1;
    auVar2 = auVar3._0_16_ ^ auVar3._16_16_;
    auVar1 = vpshufd_avx(auVar2,0xee);
    uVar4 = uVar4 | (ulong)((uint)POPCOUNT(auVar2._0_8_ ^ auVar1._0_8_) & 1) << (uVar5 & 0x3f);
  }
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    c->w64[lVar6] = 0;
  }
  c->w64[3] = uVar4;
  return;
}

Assistant:

void mzd_mul_v_parity_uint64_256_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);

  word res = 0;
  for (unsigned int i = 30; i; --i) {
    const block_t* Ablock = CONST_BLOCK(At, 30 - i);
    const word parity =
        parity64_uint64((vblock->w64[0] & Ablock->w64[0]) ^ (vblock->w64[1] & Ablock->w64[1]) ^
                        (vblock->w64[2] & Ablock->w64[2]) ^ (vblock->w64[3] & Ablock->w64[3]));
    res |= parity << (64 - i);
  }
  for (unsigned int j = 0; j < 3; j++) {
    cblock->w64[j] = 0;
  }
  cblock->w64[3] = res;
}